

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void mserialize::detail::BuiltinDeserializer<std::array<int,_10UL>,_void>::resize
               (undefined8 param_1,uint param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  size_type size;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 uVar1;
  uint in_stack_ffffffffffffff2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string local_40 [32];
  size_type local_20;
  uint local_14;
  undefined8 local_10;
  
  local_14 = param_2;
  local_10 = param_1;
  local_20 = sequence_size<std::array<int,10ul>>((array<int,_10UL> *)0x1784d3);
  if (local_20 != local_14) {
    uVar1 = 1;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    std::__cxx11::to_string(in_stack_ffffffffffffff2c);
    std::operator+((char *)CONCAT17(uVar1,in_stack_ffffffffffffff08),__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_ffffffffffffff08),(char *)__rhs);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff38);
    std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_ffffffffffffff08),(char *)__rhs);
    std::runtime_error::runtime_error((runtime_error *)__rhs,local_40);
    __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

static void resize(std::false_type /* no resize */, Sequence& s, std::uint32_t new_size)
  {
    const auto size = sequence_size(s);
    if (size != new_size)
    {
      throw std::runtime_error(
        "Serialized sequence size = " + std::to_string(new_size)
        + " != " + std::to_string(size) + " = target size, "
        "and target cannot be .resize()-ed"
      );
    }
  }